

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O1

int WebPWritePNG(FILE *out_file,WebPDecBuffer *buffer)

{
  int iVar1;
  __jmp_buf_tag *__env;
  uint uVar2;
  int iVar3;
  char cVar4;
  png_structp png;
  png_infop info;
  png_bytep row;
  
  iVar3 = 0;
  if (buffer != (WebPDecBuffer *)0x0 && out_file != (FILE *)0x0) {
    iVar3 = 0;
    png = (png_structp)png_create_write_struct("1.6.37",0,PNGErrorFunction);
    if (png != (png_structp)0x0) {
      info = (png_infop)png_create_info_struct(png);
      if (info == (png_infop)0x0) {
        png_destroy_write_struct(&png,0);
        iVar3 = 0;
      }
      else {
        __env = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
        iVar1 = _setjmp(__env);
        if (iVar1 == 0) {
          png_init_io(png,out_file);
          iVar3 = buffer->height;
          row = (buffer->u).RGBA.rgba;
          uVar2 = buffer->colorspace - MODE_RGBA;
          if ((0xb < uVar2) || (cVar4 = '\x06', (0x81dU >> (uVar2 & 0x1f) & 1) == 0)) {
            cVar4 = (0xfffffffb < buffer->colorspace - MODE_YUV) * '\x04' + '\x02';
          }
          iVar1 = (buffer->u).RGBA.stride;
          png_set_IHDR(png,info,buffer->width,iVar3,8,cVar4,0,0,0);
          png_write_info(png,info);
          if (iVar3 != 0) {
            do {
              png_write_rows(png,&row,1);
              row = row + iVar1;
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
          png_write_end(png,info);
          png_destroy_write_struct(&png,&info);
          iVar3 = 1;
        }
        else {
          png_destroy_write_struct(&png,&info);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int WebPWritePNG(FILE* out_file, const WebPDecBuffer* const buffer) {
  volatile png_structp png;
  volatile png_infop info;

  if (out_file == NULL || buffer == NULL) return 0;

  png = png_create_write_struct(PNG_LIBPNG_VER_STRING,
                                NULL, PNGErrorFunction, NULL);
  if (png == NULL) {
    return 0;
  }
  info = png_create_info_struct(png);
  if (info == NULL) {
    png_destroy_write_struct((png_structpp)&png, NULL);
    return 0;
  }
  if (setjmp(png_jmpbuf(png))) {
    png_destroy_write_struct((png_structpp)&png, (png_infopp)&info);
    return 0;
  }
  png_init_io(png, out_file);
  {
    const uint32_t width = buffer->width;
    const uint32_t height = buffer->height;
    png_bytep row = buffer->u.RGBA.rgba;
    const int stride = buffer->u.RGBA.stride;
    const int has_alpha = WebPIsAlphaMode(buffer->colorspace);
    uint32_t y;

    png_set_IHDR(png, info, width, height, 8,
                 has_alpha ? PNG_COLOR_TYPE_RGBA : PNG_COLOR_TYPE_RGB,
                 PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
                 PNG_FILTER_TYPE_DEFAULT);
    png_write_info(png, info);
    for (y = 0; y < height; ++y) {
      png_write_rows(png, &row, 1);
      row += stride;
    }
  }
  png_write_end(png, info);
  png_destroy_write_struct((png_structpp)&png, (png_infopp)&info);
  return 1;
}